

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O0

void __thiscall TApp_LotsOfFlags_Test::TestBody(TApp_LotsOfFlags_Test *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  AssertHelper local_298;
  Message local_290;
  allocator local_281;
  string local_280;
  size_t local_260;
  unsigned_long local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_2;
  Message local_238;
  allocator local_229;
  string local_228;
  size_t local_208;
  unsigned_long local_200;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_1;
  Message local_1e0;
  allocator local_1d1;
  string local_1d0;
  size_t local_1b0;
  unsigned_long local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160 [32];
  string local_140 [32];
  iterator local_120;
  size_type local_118;
  allocator local_109;
  string local_108;
  allocator local_e1;
  string local_e0;
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  TApp_LotsOfFlags_Test *local_10;
  TApp_LotsOfFlags_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"-a",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"",&local_69);
  CLI::App::add_flag(&(this->super_TApp).app,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"-A",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"",&local_b9);
  CLI::App::add_flag(&(this->super_TApp).app,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"-b",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"",&local_109);
  CLI::App::add_flag(&(this->super_TApp).app,&local_e0,&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  gtest_ar.message_.ptr_._4_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_180,"-a",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"-b",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"-aA",(allocator *)((long)&gtest_ar.message_.ptr_ + 5));
  gtest_ar.message_.ptr_._4_1_ = 0;
  local_120 = &local_180;
  local_118 = 3;
  __l._M_len = 3;
  __l._M_array = local_120;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_TApp).args,__l);
  local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_120;
  do {
    local_320 = local_320 + -1;
    std::__cxx11::string::~string((string *)local_320);
  } while (local_320 != &local_180);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run(&this->super_TApp);
  local_1a8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"-a",&local_1d1);
  local_1b0 = CLI::App::count(&(this->super_TApp).app,&local_1d0);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1a0,"(size_t)2","app.count(\"-a\")",&local_1a8,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x85,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_200 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"-b",&local_229);
  local_208 = CLI::App::count(&(this->super_TApp).app,&local_228);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1f8,"(size_t)1","app.count(\"-b\")",&local_200,&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_238);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x86,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_258 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"-A",&local_281);
  local_260 = CLI::App::count(&(this->super_TApp).app,&local_280);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_250,"(size_t)1","app.count(\"-A\")",&local_258,&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              (&local_298,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/AppTest.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=(&local_298,&local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_298);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  return;
}

Assistant:

TEST_F(TApp, LotsOfFlags) {

    app.add_flag("-a");
    app.add_flag("-A");
    app.add_flag("-b");

    args = {"-a", "-b", "-aA"};
    run();
    EXPECT_EQ((size_t)2, app.count("-a"));
    EXPECT_EQ((size_t)1, app.count("-b"));
    EXPECT_EQ((size_t)1, app.count("-A"));
}